

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void init_output(aec_stream *strm)

{
  internal_state *piVar1;
  internal_state *state;
  aec_stream *strm_local;
  
  piVar1 = strm->state;
  if (strm->avail_out < 0x103) {
    if ((piVar1->zero_blocks == 0) || (piVar1->direct_out != 0)) {
      piVar1->cds_buf[0] = *piVar1->cds;
      piVar1->cds = piVar1->cds_buf;
    }
    piVar1->direct_out = 0;
  }
  else if (piVar1->direct_out == 0) {
    piVar1->direct_out = 1;
    *strm->next_out = *piVar1->cds;
    piVar1->cds = strm->next_out;
  }
  return;
}

Assistant:

static void init_output(struct aec_stream *strm)
{
    /**
       Direct output to next_out if next_out can hold a Coded Data
       Set, use internal buffer otherwise.
    */

    struct internal_state *state = strm->state;

    if (strm->avail_out > CDSLEN) {
        if (!state->direct_out) {
            state->direct_out = 1;
            *strm->next_out = *state->cds;
            state->cds = strm->next_out;
        }
    } else {
        if (state->zero_blocks == 0 || state->direct_out) {
            /* copy leftover from last block */
            *state->cds_buf = *state->cds;
            state->cds = state->cds_buf;
        }
        state->direct_out = 0;
    }
}